

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O3

void mbedtls_sha256_starts(mbedtls_sha256_context *ctx,int is224)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  
  ctx->total[0] = 0;
  ctx->total[1] = 0;
  if (is224 == 0) {
    uVar1 = 0x6a09e667;
    uVar2 = 0xbb67ae85;
    uVar3 = 0x3c6ef372;
    uVar4 = 0xa54ff53a;
    uVar5 = 0x510e527f;
    uVar6 = 0x9b05688c;
    uVar7 = 0x1f83d9ab;
    uVar8 = 0x5be0cd19;
  }
  else {
    uVar1 = 0xc1059ed8;
    uVar2 = 0x367cd507;
    uVar3 = 0x3070dd17;
    uVar4 = 0xf70e5939;
    uVar5 = 0xffc00b31;
    uVar6 = 0x68581511;
    uVar7 = 0x64f98fa7;
    uVar8 = 0xbefa4fa4;
  }
  ctx->state[0] = uVar1;
  ctx->state[1] = uVar2;
  ctx->state[2] = uVar3;
  ctx->state[3] = uVar4;
  ctx->state[4] = uVar5;
  ctx->state[5] = uVar6;
  ctx->state[6] = uVar7;
  ctx->state[7] = uVar8;
  ctx->is224 = is224;
  return;
}

Assistant:

void mbedtls_sha256_starts( mbedtls_sha256_context *ctx, int is224 )
{
    ctx->total[0] = 0;
    ctx->total[1] = 0;

    if( is224 == 0 )
    {
        /* SHA-256 */
        ctx->state[0] = 0x6A09E667;
        ctx->state[1] = 0xBB67AE85;
        ctx->state[2] = 0x3C6EF372;
        ctx->state[3] = 0xA54FF53A;
        ctx->state[4] = 0x510E527F;
        ctx->state[5] = 0x9B05688C;
        ctx->state[6] = 0x1F83D9AB;
        ctx->state[7] = 0x5BE0CD19;
    }
    else
    {
        /* SHA-224 */
        ctx->state[0] = 0xC1059ED8;
        ctx->state[1] = 0x367CD507;
        ctx->state[2] = 0x3070DD17;
        ctx->state[3] = 0xF70E5939;
        ctx->state[4] = 0xFFC00B31;
        ctx->state[5] = 0x68581511;
        ctx->state[6] = 0x64F98FA7;
        ctx->state[7] = 0xBEFA4FA4;
    }

    ctx->is224 = is224;
}